

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O3

int main(void)

{
  cio_error cVar1;
  __sighandler_t p_Var2;
  cio_inet_address *inet_address;
  int iVar3;
  cio_http_location target_foo;
  cio_http_server_configuration config;
  cio_http_location local_f0;
  cio_http_server_configuration local_d0;
  
  p_Var2 = signal(0xf,sighandler);
  iVar3 = -1;
  if (p_Var2 != (__sighandler_t)0xffffffffffffffff) {
    p_Var2 = signal(2,sighandler);
    if (p_Var2 == (__sighandler_t)0xffffffffffffffff) {
      signal(0xf,(__sighandler_t)0x0);
    }
    else {
      cVar1 = cio_eventloop_init(&loop);
      iVar3 = 1;
      if (cVar1 == CIO_SUCCESS) {
        memcpy(&local_d0,&DAT_0010ea00,0xb8);
        inet_address = cio_get_inet_address_any4();
        cVar1 = cio_init_inet_socket_address(&local_d0.endpoint,inet_address,0x1f90);
        iVar3 = 1;
        if (cVar1 == CIO_SUCCESS) {
          cVar1 = cio_http_server_init(&http_server,&loop,&local_d0);
          if (cVar1 == CIO_SUCCESS) {
            cio_http_location_init(&local_f0,"/foo",(void *)0x0,alloc_dummy_handler);
            cio_http_server_register_location(&http_server,&local_f0);
            cVar1 = cio_http_server_serve(&http_server);
            if (cVar1 == CIO_SUCCESS) {
              cio_eventloop_run(&loop);
              iVar3 = 0;
            }
          }
        }
        cio_eventloop_destroy(&loop);
      }
    }
  }
  return iVar3;
}

Assistant:

int main(void)
{
	int ret = EXIT_SUCCESS;
	if (signal(SIGTERM, sighandler) == SIG_ERR) {
		return -1;
	}

	if (signal(SIGINT, sighandler) == SIG_ERR) {
		(void)signal(SIGTERM, SIG_DFL);
		return -1;
	}

	enum cio_error err = cio_eventloop_init(&loop);
	if (err != CIO_SUCCESS) {
		return EXIT_FAILURE;
	}

	struct cio_http_server_configuration config = {
	    .on_error = serve_error,
	    .read_header_timeout_ns = HEADER_READ_TIMEOUT,
	    .read_body_timeout_ns = BODY_READ_TIMEOUT,
	    .response_timeout_ns = RESPONSE_TIMEOUT,
	    .close_timeout_ns = CLOSE_TIMEOUT_NS,
	    .use_tcp_fastopen = true,
	    .alloc_client = alloc_http_client,
	    .free_client = free_http_client};

	err = cio_init_inet_socket_address(&config.endpoint, cio_get_inet_address_any4(), HTTPSERVER_LISTEN_PORT);
	if (err != CIO_SUCCESS) {
		ret = EXIT_FAILURE;
		goto destroy_loop;
	}

	err = cio_http_server_init(&http_server, &loop, &config);
	if (err != CIO_SUCCESS) {
		ret = EXIT_FAILURE;
		goto destroy_loop;
	}

	struct cio_http_location target_foo;
	cio_http_location_init(&target_foo, "/foo", NULL, alloc_dummy_handler);
	cio_http_server_register_location(&http_server, &target_foo);

	err = cio_http_server_serve(&http_server);
	if (err != CIO_SUCCESS) {
		ret = EXIT_FAILURE;
		goto destroy_loop;
	}

	cio_eventloop_run(&loop);

destroy_loop:
	cio_eventloop_destroy(&loop);
	return ret;
}